

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitStringAs(PrintExpressionContents *this,StringAs *curr)

{
  StringAsOp SVar1;
  StringAs *curr_local;
  PrintExpressionContents *this_local;
  
  SVar1 = curr->op;
  if (SVar1 == StringAsWTF8) {
    printMedium(this->o,"string.as_wtf8");
  }
  else if (SVar1 == StringAsWTF16) {
    printMedium(this->o,"string.as_wtf16");
  }
  else {
    if (SVar1 != StringAsIter) {
      handle_unreachable("invalid string.as*",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Print.cpp"
                         ,0x9b8);
    }
    printMedium(this->o,"string.as_iter");
  }
  return;
}

Assistant:

void visitStringAs(StringAs* curr) {
    switch (curr->op) {
      case StringAsWTF8:
        printMedium(o, "string.as_wtf8");
        break;
      case StringAsWTF16:
        printMedium(o, "string.as_wtf16");
        break;
      case StringAsIter:
        printMedium(o, "string.as_iter");
        break;
      default:
        WASM_UNREACHABLE("invalid string.as*");
    }
  }